

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterquietus.cpp
# Opt level: O1

int AF_A_DropWeaponPieces(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 *puVar5;
  PClassActor *pPVar6;
  double __x;
  double dVar7;
  PClass *pPVar8;
  uint uVar9;
  undefined8 uVar10;
  PClass *pPVar11;
  AActor *pAVar12;
  PClassActor *pPVar13;
  PClassActor *pPVar14;
  PClassActor *pPVar15;
  int iVar16;
  char *pcVar17;
  int iVar18;
  bool bVar19;
  DVector3 local_48;
  
  pPVar8 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar17 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar5 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar5 != (undefined8 *)0x0) {
        if (puVar5[1] == 0) {
          uVar10 = (**(code **)*puVar5)(puVar5);
          puVar5[1] = uVar10;
        }
        pPVar11 = (PClass *)puVar5[1];
        bVar19 = pPVar11 != (PClass *)0x0;
        if (pPVar11 != pPVar8 && bVar19) {
          do {
            pPVar11 = pPVar11->ParentClass;
            bVar19 = pPVar11 != (PClass *)0x0;
            if (pPVar11 == pPVar8) break;
          } while (pPVar11 != (PClass *)0x0);
        }
        if (!bVar19) {
          pcVar17 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b466d;
        }
      }
      if (numparam == 1) {
        pcVar17 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          pPVar6 = (PClassActor *)param[1].field_0.field_1.a;
          if ((pPVar6 != (PClassActor *)0x0) &&
             (pPVar13 = pPVar6, pPVar6 != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
            do {
              pPVar13 = (PClassActor *)(pPVar13->super_PClass).ParentClass;
              if (pPVar13 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
            } while (pPVar13 != (PClassActor *)0x0);
            if (pPVar13 == (PClassActor *)0x0) {
              pcVar17 = "p1 == NULL || p1->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_005b468c;
            }
          }
          if (numparam < 3) {
            pcVar17 = "(paramnum) < numparam";
          }
          else {
            if ((param[2].field_0.field_3.Type == '\x03') &&
               ((param[2].field_0.field_1.atag == 1 || (param[2].field_0.field_1.a == (void *)0x0)))
               ) {
              pPVar13 = (PClassActor *)param[2].field_0.field_1.a;
              if ((pPVar13 != (PClassActor *)0x0) &&
                 (pPVar14 = pPVar13, pPVar13 != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
                do {
                  pPVar14 = (PClassActor *)(pPVar14->super_PClass).ParentClass;
                  if (pPVar14 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
                } while (pPVar14 != (PClassActor *)0x0);
                if (pPVar14 == (PClassActor *)0x0) {
                  pcVar17 = "p2 == NULL || p2->IsDescendantOf(RUNTIME_CLASS(AActor))";
                  goto LAB_005b46ab;
                }
              }
              if (numparam == 3) {
                pcVar17 = "(paramnum) < numparam";
              }
              else {
                if ((param[3].field_0.field_3.Type == '\x03') &&
                   ((param[3].field_0.field_1.atag == 1 ||
                    (param[3].field_0.field_1.a == (void *)0x0)))) {
                  pPVar14 = (PClassActor *)param[3].field_0.field_1.a;
                  if ((pPVar14 != (PClassActor *)0x0) &&
                     (pPVar15 = pPVar14, pPVar14 != (PClassActor *)AActor::RegistrationInfo.MyClass)
                     ) {
                    do {
                      pPVar15 = (PClassActor *)(pPVar15->super_PClass).ParentClass;
                      if (pPVar15 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
                    } while (pPVar15 != (PClassActor *)0x0);
                    if (pPVar15 == (PClassActor *)0x0) {
                      pcVar17 = "p3 == NULL || p3->IsDescendantOf(RUNTIME_CLASS(AActor))";
                      goto LAB_005b46ca;
                    }
                  }
                  iVar18 = 0;
                  iVar16 = 0;
                  do {
                    pPVar15 = pPVar14;
                    if (iVar16 == 1) {
                      pPVar15 = pPVar13;
                    }
                    if (iVar16 == 0) {
                      pPVar15 = pPVar6;
                    }
                    if (pPVar15 != (PClassActor *)0x0) {
                      local_48.X = (double)puVar5[9];
                      local_48.Y = (double)puVar5[10];
                      local_48.Z = (double)puVar5[0xb];
                      pAVar12 = AActor::StaticSpawn(pPVar15,&local_48,ALLOW_REPLACE,false);
                      if (pAVar12 != (AActor *)0x0) {
                        __x = FFastTrig::cos(&fasttrig,
                                             (double)iVar18 * 11930464.711111112 +
                                             6755399441055744.0);
                        dVar7 = FFastTrig::sin(&fasttrig,__x);
                        dVar2 = (double)puVar5[0x15];
                        dVar3 = (double)puVar5[0x16];
                        dVar4 = (double)puVar5[0x17];
                        pbVar1 = (byte *)((long)&(pAVar12->flags).Value + 2);
                        *pbVar1 = *pbVar1 | 2;
                        (pAVar12->Vel).Z = dVar4;
                        (pAVar12->Vel).Y = dVar7 + dVar3;
                        (pAVar12->Vel).X = __x + dVar2;
                        if (iVar16 == 0) {
                          uVar9 = FRandom::GenRand32(&pr_quietusdrop);
                          iVar16 = (uVar9 & 1) + 1;
                        }
                        else {
                          iVar16 = 3 - iVar16;
                        }
                      }
                    }
                    iVar18 = iVar18 + 0x78;
                  } while (iVar18 != 0x168);
                  return 0;
                }
                pcVar17 = 
                "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ;
              }
LAB_005b46ca:
              __assert_fail(pcVar17,
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                            ,0x20,
                            "int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                           );
            }
            pcVar17 = 
            "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
            ;
          }
LAB_005b46ab:
          __assert_fail(pcVar17,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                        ,0x1f,
                        "int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        pcVar17 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_005b468c:
      __assert_fail(pcVar17,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                    ,0x1e,
                    "int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    pcVar17 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005b466d:
  __assert_fail(pcVar17,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                ,0x1d,"int AF_A_DropWeaponPieces(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_DropWeaponPieces)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(p1, AActor);
	PARAM_CLASS(p2, AActor);
	PARAM_CLASS(p3, AActor);

	for (int i = 0, j = 0; i < 3; ++i)
	{
		PClassActor *cls = j == 0 ?  p1 : j == 1 ? p2 : p3;
		if (cls)
		{
			AActor *piece = Spawn (cls, self->Pos(), ALLOW_REPLACE);
			if (piece != NULL)
			{
				piece->Vel = self->Vel + DAngle(i*120.).ToVector(1);
				piece->flags |= MF_DROPPED;
				j = (j == 0) ? (pr_quietusdrop() & 1) + 1 : 3-j;
			}
		}
	}
	return 0;
}